

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O3

void __thiscall
TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test::testBody
          (TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test *this)

{
  MemoryAccountant *this_00;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  SimpleString local_28;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant;
  MemoryAccountant::dealloc(this_00,0);
  MemoryAccountant::dealloc(this_00,4);
  MemoryAccountant::dealloc(this_00,4);
  MemoryAccountant::alloc(this_00,4);
  pUVar1 = UtestShell::getCurrent();
  MemoryAccountant::report((MemoryAccountant *)&local_28);
  pcVar2 = SimpleString::asCharString(&local_28);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "CppUTest Memory Accountant report:\nAllocation size     # allocations    # deallocations   max # allocations at one time\nother                   0                1                 0\n    4                   1                2                 1\n   Thank you for your business\n"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x1d0,pTVar3);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportAllocationsWithSizeZero)
{
    accountant.dealloc(0);

    accountant.dealloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);

    STRCMP_EQUAL("CppUTest Memory Accountant report:\n"
                 "Allocation size     # allocations    # deallocations   max # allocations at one time\n"
                 "other                   0                1                 0\n"
                 "    4                   1                2                 1\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}